

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

HierarchyInstantiationSyntax * __thiscall
slang::parsing::Parser::parseHierarchyInstantiation(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_01;
  Token type_00;
  Token semi_00;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *ptVar1;
  bool bVar2;
  HierarchyInstantiationSyntax *pHVar3;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  ParserBase *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  Token semi;
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *set;
  iterator __end3;
  iterator __begin3;
  SmallVector<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_4UL>
  *__range3;
  bool found;
  string_view name;
  ParameterValueAssignmentSyntax *parameters;
  Token type;
  locator loc;
  size_t pos0;
  size_t hash_1;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffaf8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffb00;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffb0c;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb18;
  ParameterValueAssignmentSyntax *pPVar5;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffb20;
  Info *pIVar6;
  ParserBase *pPVar7;
  Info *pIVar8;
  basic_string_view<char,_std::char_traits<char>_> *args;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffb68;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb88;
  iterator puVar9;
  ParserBase *pPVar10;
  Parser *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc10;
  RequireItems requireItems;
  Token *in_stack_fffffffffffffc18;
  TokenKind in_stack_fffffffffffffc24;
  TokenKind in_stack_fffffffffffffc26;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffc28;
  ParserBase *in_stack_fffffffffffffc30;
  DiagCode in_stack_fffffffffffffc40;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffc48;
  AllowEmpty in_stack_fffffffffffffc50;
  undefined1 local_3a0 [16];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_390 [4];
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *local_2b8;
  ParameterValueAssignmentSyntax *pPStack_2b0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_2a8;
  iterator local_290;
  char_pointer local_280;
  table_element_pointer local_278;
  iterator local_270;
  iterator local_268;
  iterator local_260;
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_258;
  byte local_249;
  undefined1 local_248 [64];
  undefined1 *local_208;
  size_t *local_200;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_1f8;
  iterator local_1f0;
  char_pointer local_1e8;
  table_element_pointer local_1e0;
  undefined1 *local_1d8;
  size_t *local_1d0;
  bool local_1c1 [25];
  iterator local_1a8;
  bool local_191 [25];
  iterator local_178;
  bool local_161;
  iterator local_160;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_150;
  size_t local_138;
  size_t local_130;
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  undefined1 *local_120;
  size_t *local_118;
  uint local_10c;
  value_type *local_108;
  value_type *local_100;
  uint local_f4;
  group_type *local_f0;
  size_t local_e8;
  pow2_quadratic_prober local_e0;
  size_t local_d0;
  size_t local_c8;
  basic_string_view<char,_std::char_traits<char>_> *local_c0;
  size_t *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_b0;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_98;
  iterator local_90;
  iterator local_88;
  size_t local_78;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_70;
  iterator local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_10;
  iterator local_8;
  
  local_248._24_16_ =
       (undefined1  [16])
       ParserBase::expect(in_RDI,(TokenKind)((ulong)in_stack_fffffffffffffb88 >> 0x30));
  local_248._16_8_ = parseParameterValueAssignment(in_stack_fffffffffffffbf8);
  local_248._0_16_ =
       (undefined1  [16])Token::valueText((Token *)in_stack_fffffffffffffb10._M_extent_value);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_248);
  requireItems = (RequireItems)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  pPVar10 = in_RDI;
  if ((!bVar2) && (local_248._24_2_ == Identifier)) {
    local_249 = 0;
    local_258 = (SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)&in_RDI[2].lastPoppedDelims.second;
    local_260 = SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::begin(local_258);
    local_268 = SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::end(local_258);
    for (; puVar9 = local_260, local_260 != local_268; local_260 = local_260 + 1) {
      local_270 = local_260;
      local_1f0 = local_260;
      local_1f8 = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_248;
      local_90 = local_260;
      local_68 = local_260;
      local_98 = local_1f8;
      local_70 = local_1f8;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                           (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      ptVar1 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::position_for(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      local_8 = puVar9;
      local_10 = ptVar1;
      local_20 = local_78;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)0x5d8129);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                              (size_t)in_stack_fffffffffffffb00);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)0x5d8177);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffffb68 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)0x5d81ca);
            in_stack_fffffffffffffb70 = local_10;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)0x5d81f7);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffb10._M_extent_value);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_005d82ee;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
        if (bVar2) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::table_locator(&local_b0);
          goto LAB_005d82ee;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,
                           (puVar9->table_).
                           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                           .arrays.groups_size_mask);
      } while (bVar2);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::table_locator(&local_b0);
LAB_005d82ee:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::make_iterator((locator *)0x5d82fb);
      local_1e8 = local_88.pc_;
      local_1e0 = local_88.p_;
      local_280 = local_88.pc_;
      local_278 = local_88.p_;
      local_290 = boost::unordered::
                  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)0x5d8358);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffb00,
                         (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffaf8);
      if (bVar2) {
        local_249 = 1;
        break;
      }
    }
    requireItems = (RequireItems)((ulong)in_stack_fffffffffffffc10 >> 0x20);
    pPVar10 = in_RDI;
    if ((local_249 & 1) == 0) {
      args = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[1].window.capacity;
      local_208 = local_248;
      local_200 = (size_t *)args;
      local_1d8 = local_208;
      local_1d0 = (size_t *)args;
      local_120 = local_208;
      local_118 = (size_t *)args;
      local_128 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                            ((basic_string_view<char,_std::char_traits<char>_> *)0x5d843a);
      local_130 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      local_138 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::position_for(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      local_c0 = local_128;
      local_d0 = local_130;
      local_c8 = local_138;
      local_b8 = (size_t *)args;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_e0,local_138);
      do {
        local_e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_e0);
        local_f0 = boost::unordered::detail::foa::
                   table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)0x5d84f4);
        local_f0 = local_f0 + local_e8;
        local_f4 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                              (size_t)in_stack_fffffffffffffb00);
        if (local_f4 != 0) {
          local_100 = boost::unordered::detail::foa::
                      table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  *)0x5d853f);
          local_108 = local_100 + local_e8 * 0xf;
          do {
            local_10c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x5d858f);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)0x5d85bc);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffb10._M_extent_value);
            requireItems = (RequireItems)((ulong)in_stack_fffffffffffffc10 >> 0x20);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::table_locator(&local_150,local_f0,local_10c,local_108 + local_10c);
              goto LAB_005d86b0;
            }
            local_f4 = local_f4 - 1 & local_f4;
          } while (local_f4 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
        requireItems = (RequireItems)((ulong)in_stack_fffffffffffffc10 >> 0x20);
        if (bVar2) {
          memset(&local_150,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::table_locator(&local_150);
          goto LAB_005d86b0;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_e0,(size_t)args->_M_str);
        requireItems = (RequireItems)((ulong)in_stack_fffffffffffffc10 >> 0x20);
      } while (bVar2);
      memset(&local_150,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::table_locator(&local_150);
LAB_005d86b0:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_150);
      if (bVar2) {
        local_160 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::make_iterator((locator *)0x5d86d0);
        local_161 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_2a8,&local_160,&local_161);
      }
      else if (*(ulong *)(in_RDI[1].skippedTokens.super_SmallVectorBase<slang::parsing::Token>.
                          firstElement + 8) <
               *(ulong *)in_RDI[1].skippedTokens.super_SmallVectorBase<slang::parsing::Token>.
                         firstElement) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                  (in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18,
                   in_stack_fffffffffffffb10._M_extent_value,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        local_178 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::make_iterator((locator *)0x5d8750);
        local_191[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_2a8,&local_178,local_191);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                  (in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,args);
        local_1a8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::make_iterator((locator *)0x5d87b6);
        local_1c1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_2a8,&local_1a8,local_1c1);
      }
    }
  }
  Token::Token((Token *)in_stack_fffffffffffffb00);
  pIVar8 = (Info *)(local_3a0 + 0x10);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x5d8813);
  local_3a0._12_4_ = 0x400005;
  this_00 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)local_3a0;
  uVar4 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseHierarchyInstantiation(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc26,
             in_stack_fffffffffffffc24,in_stack_fffffffffffffc18,requireItems,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,in_stack_fffffffffffffc50);
  pPVar7 = pPVar10 + 1;
  elements_00._M_ptr._4_4_ = in_stack_fffffffffffffb0c;
  elements_00._M_ptr._0_4_ = uVar4;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffb10._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,elements_00);
  pPVar5 = (ParameterValueAssignmentSyntax *)local_248._16_8_;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_3a0 + 0x10),
             (EVP_PKEY_CTX *)pPVar10->alloc,src);
  elements_01._M_ptr._4_4_ = in_stack_fffffffffffffb0c;
  elements_01._M_ptr._0_4_ = uVar4;
  elements_01._M_extent._M_extent_value = in_stack_fffffffffffffb10._M_extent_value;
  pIVar6 = extraout_RDX;
  slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (this_00,elements_01);
  type_00.info = pIVar6;
  type_00._0_8_ = pPVar5;
  semi_00.info = pIVar8;
  semi_00._0_8_ = pPVar7;
  pHVar3 = slang::syntax::SyntaxFactory::hierarchyInstantiation
                     ((SyntaxFactory *)in_stack_fffffffffffffb10._M_extent_value,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                      CONCAT44(in_stack_fffffffffffffb0c,uVar4),type_00,pPStack_2b0,local_2b8,
                      semi_00);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x5d898b);
  return pHVar3;
}

Assistant:

HierarchyInstantiationSyntax& Parser::parseHierarchyInstantiation(AttrList attributes) {
    auto type = expect(TokenKind::Identifier);
    auto parameters = parseParameterValueAssignment();

    // If this is an instantiation of a global module/interface/program,
    // keep track of it in our instantiatedModules set.
    std::string_view name = type.valueText();
    if (!name.empty() && type.kind == TokenKind::Identifier) {
        bool found = false;
        for (auto& set : moduleDeclStack) {
            if (set.find(name) != set.end()) {
                found = true;
                break;
            }
        }
        if (!found)
            meta.globalInstances.emplace(name);
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.hierarchyInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}